

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_getrawsocket.c
# Opt level: O3

int os_fd_generic_getrawsocket
              (os_fd *sock,netaddr_socket *bind_to,int protocol,size_t recvbuf,os_interface *os_if,
              oonf_log_source log_src)

{
  ushort uVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  
  uVar2 = (ulong)log_src;
  uVar1 = (bind_to->v4).sin_family;
  iVar3 = socket((uint)uVar1,3,protocol);
  sock->fd = iVar3;
  if (iVar3 < 0) {
    if (((&log_global_mask)[uVar2] & 4) == 0) {
      return -1;
    }
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    oonf_log(4,uVar2,"src/base/os_generic/os_fd_generic_getrawsocket.c",0x4d,0,0,
             "Cannot open socket: %s (%d)",pcVar5,*piVar4);
    return -1;
  }
  if ((uVar1 == 2) && (iVar3 = setsockopt(iVar3,0,3,&os_fd_generic_getrawsocket::zero,4), iVar3 < 0)
     ) {
    if (((&log_global_mask)[uVar2] & 4) != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      oonf_log(4,uVar2,"src/base/os_generic/os_fd_generic_getrawsocket.c",0x53,0,0,
               "Cannot disable IP_HDRINCL for socket: %s (%d)",pcVar5,*piVar4);
    }
  }
  else {
    iVar3 = os_fd_generic_configsocket(sock,bind_to,recvbuf,true,os_if,log_src);
    if (iVar3 == 0) {
      return 0;
    }
  }
  if (sock->fd != -1) {
    close(sock->fd);
    sock->fd = -1;
  }
  return -1;
}

Assistant:

int
os_fd_generic_getrawsocket(struct os_fd *sock, const union netaddr_socket *bind_to, int protocol, size_t recvbuf,
  const struct os_interface *os_if, enum oonf_log_source log_src __attribute__((unused))) {
  static const int zero = 0;
  int family;

  family = bind_to->std.sa_family;
  sock->fd = socket(family, SOCK_RAW, protocol);
  if (sock->fd < 0) {
    OONF_WARN(log_src, "Cannot open socket: %s (%d)", strerror(errno), errno);
    return -1;
  }

  if (family == AF_INET) {
    if (setsockopt(sock->fd, IPPROTO_IP, IP_HDRINCL, &zero, sizeof(zero)) < 0) {
      OONF_WARN(log_src, "Cannot disable IP_HDRINCL for socket: %s (%d)", strerror(errno), errno);
      os_fd_close(sock);
      return -1;
    }
  }

  if (os_fd_configsocket(sock, bind_to, recvbuf, true, os_if, log_src)) {
    os_fd_close(sock);
    return -1;
  }
  return 0;
}